

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarQueueReorderFromMousePos
               (ImGuiTabBar *tab_bar,ImGuiTabItem *src_tab,ImVec2 mouse_pos)

{
  float fVar1;
  int iVar2;
  ImGuiTabItem *pIVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  fVar11 = mouse_pos.x;
  if (tab_bar->ReorderRequestTabId != 0) {
    __assert_fail("tab_bar->ReorderRequestTabId == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_widgets.cpp"
                  ,0x1e75,
                  "void ImGui::TabBarQueueReorderFromMousePos(ImGuiTabBar *, const ImGuiTabItem *, ImVec2)"
                 );
  }
  if ((tab_bar->Flags & 1) != 0) {
    fVar12 = 0.0;
    if ((src_tab->Flags & 0xc0U) == 0) {
      fVar12 = tab_bar->ScrollingTarget;
    }
    fVar12 = (tab_bar->BarRect).Min.x - fVar12;
    fVar13 = src_tab->Offset + fVar12;
    pIVar3 = (tab_bar->Tabs).Data;
    if ((src_tab < pIVar3) || (iVar2 = (tab_bar->Tabs).Size, pIVar3 + iVar2 <= src_tab)) {
      __assert_fail("it >= Data && it < Data + Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.h"
                    ,0x724,
                    "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]"
                   );
    }
    uVar9 = ((long)src_tab - (long)pIVar3 >> 2) * 0x2e8ba2e8ba2e8ba3;
    uVar8 = (uint)uVar9;
    if ((int)uVar8 < iVar2 && -1 < (int)uVar8) {
      uVar6 = (ulong)(uVar8 & 0x7fffffff);
      uVar10 = pIVar3[uVar6].Flags;
      uVar5 = uVar8;
      if ((uVar10 & 0x20) == 0) {
        uVar7 = uVar9 & 0xffffffff;
        uVar9 = uVar9 & 0xffffffff;
        while( true ) {
          uVar5 = (uint)uVar7;
          if (((uVar10 ^ src_tab->Flags) & 0xc0) != 0) break;
          fVar14 = pIVar3[uVar6].Offset + fVar12;
          fVar1 = (GImGui->Style).ItemInnerSpacing.x;
          bVar4 = pIVar3[uVar6].Width + fVar14 + fVar1 <= fVar11;
          if (fVar11 < fVar13) {
            bVar4 = fVar11 <= fVar14 - fVar1;
          }
          uVar5 = (uint)uVar9;
          if (!bVar4) break;
          uVar10 = uVar5 + (uint)(fVar13 <= fVar11) * 2 + -1;
          uVar6 = (ulong)uVar10;
          if (((int)uVar10 < 0) || (iVar2 <= (int)uVar10)) break;
          uVar10 = pIVar3[uVar6].Flags;
          uVar7 = uVar9;
          uVar9 = uVar6;
          if ((uVar10 & 0x20) != 0) break;
        }
      }
      if (uVar5 - uVar8 != 0) {
        TabBarQueueReorder(tab_bar,src_tab,uVar5 - uVar8);
        return;
      }
    }
  }
  return;
}

Assistant:

void ImGui::TabBarQueueReorderFromMousePos(ImGuiTabBar* tab_bar, const ImGuiTabItem* src_tab, ImVec2 mouse_pos)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(tab_bar->ReorderRequestTabId == 0);
    if ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) == 0)
        return;

    const bool is_central_section = (src_tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    const float bar_offset = tab_bar->BarRect.Min.x - (is_central_section ? tab_bar->ScrollingTarget : 0);

    // Count number of contiguous tabs we are crossing over
    const int dir = (bar_offset + src_tab->Offset) > mouse_pos.x ? -1 : +1;
    const int src_idx = tab_bar->Tabs.index_from_ptr(src_tab);
    int dst_idx = src_idx;
    for (int i = src_idx; i >= 0 && i < tab_bar->Tabs.Size; i += dir)
    {
        // Reordered tabs must share the same section
        const ImGuiTabItem* dst_tab = &tab_bar->Tabs[i];
        if (dst_tab->Flags & ImGuiTabItemFlags_NoReorder)
            break;
        if ((dst_tab->Flags & ImGuiTabItemFlags_SectionMask_) != (src_tab->Flags & ImGuiTabItemFlags_SectionMask_))
            break;
        dst_idx = i;

        // Include spacing after tab, so when mouse cursor is between tabs we would not continue checking further tabs that are not hovered.
        const float x1 = bar_offset + dst_tab->Offset - g.Style.ItemInnerSpacing.x;
        const float x2 = bar_offset + dst_tab->Offset + dst_tab->Width + g.Style.ItemInnerSpacing.x;
        //GetForegroundDrawList()->AddRect(ImVec2(x1, tab_bar->BarRect.Min.y), ImVec2(x2, tab_bar->BarRect.Max.y), IM_COL32(255, 0, 0, 255));
        if ((dir < 0 && mouse_pos.x > x1) || (dir > 0 && mouse_pos.x < x2))
            break;
    }

    if (dst_idx != src_idx)
        TabBarQueueReorder(tab_bar, src_tab, dst_idx - src_idx);
}